

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O2

void __thiscall TUPU::TImage::~TImage(TImage *this)

{
  this->_vptr_TImage = (_func_int **)&PTR__TImage_00503d28;
  free(this->m_buffer);
  std::__cxx11::string::~string((string *)&this->m_filename);
  std::__cxx11::string::~string((string *)&this->m_sequenceId);
  std::__cxx11::string::~string((string *)&this->m_tag);
  std::__cxx11::string::~string((string *)&this->m_path);
  std::__cxx11::string::~string((string *)&this->m_url);
  return;
}

Assistant:

TImage::~TImage()
{
    std::free(m_buffer);
}